

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.h
# Opt level: O0

void __thiscall Diligent::IShader::IShader(IShader *this)

{
  IShader *this_local;
  
  IDeviceObject::IDeviceObject(&this->super_IDeviceObject);
  (this->super_IDeviceObject).super_IObject._vptr_IObject =
       (_func_int **)&PTR___cxa_pure_virtual_01399ec0;
  return;
}

Assistant:

DILIGENT_BEGIN_INTERFACE(IShader, IDeviceObject)
{
#if DILIGENT_CPP_INTERFACE
    /// Returns the shader description
    virtual const ShaderDesc& METHOD(GetDesc)() const override = 0;
#endif

    /// Returns the total number of shader resources
    VIRTUAL Uint32 METHOD(GetResourceCount)(THIS) CONST PURE;

    /// Returns the pointer to the array of shader resources
    VIRTUAL void METHOD(GetResourceDesc)(THIS_
                                         Uint32 Index,
                                         ShaderResourceDesc REF ResourceDesc) CONST PURE;

    /// For a constant buffer resource, returns the buffer description. See Diligent::ShaderCodeBufferDesc.

    /// \param [in] Index - Resource index, same as used by GetResourceDesc.
    ///
    /// \return     A pointer to ShaderCodeBufferDesc struct describing the constant buffer.
    ///
    /// This method requires that the `LoadConstantBufferReflection` flag was set to `true`
    /// when the shader was created.
    VIRTUAL const ShaderCodeBufferDesc* METHOD(GetConstantBufferDesc)(THIS_
                                               Uint32 Index) CONST PURE;

    /// Returns the shader bytecode.

    /// \param [out] ppBytecode - A pointer to the memory location where
    ///                           a pointer to the byte code will be written.
    /// \param [out] Size       - The size of the byte code.
    ///
    /// For OpenGL, this method returns the full GLSL source.
    ///
    /// The pointer returned by the method remains valid while the
    /// shader object is alive. An application must NOT free the memory.
    VIRTUAL void METHOD(GetBytecode)(THIS_
                                     const void** ppBytecode,
                                     Uint64 REF   Size) CONST PURE;

    /// Returns the shader status, see Diligent::SHADER_STATUS.

    /// \param [in] WaitForCompletion - If true, the method will wait until the shader is compiled.
    ///                                 If false, the method will return the shader status without waiting.
    /// 							    This parameter is ignored if the shader was compiled synchronously.
    /// \return     The shader status.
    VIRTUAL SHADER_STATUS METHOD(GetStatus)(THIS_
                                            bool WaitForCompletion DEFAULT_VALUE(false)) PURE;
}